

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_exceptions.cpp
# Opt level: O0

void joined_subflow_2(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  Executor *this;
  void *__stat_loc;
  double __x;
  Expression_lhs<const_std::atomic<bool>_&> EVar2;
  ResultBuilder DOCTEST_RB;
  atomic<bool> post_join;
  Taskflow taskflow;
  Executor executor;
  nullptr_t in_stack_fffffffffffffca8;
  Result *res;
  Taskflow *in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb8;
  int in_stack_fffffffffffffcbc;
  char *in_stack_fffffffffffffcc0;
  Enum at;
  Taskflow *this_00;
  char *in_stack_fffffffffffffce0;
  anon_class_8_1_8cf6e809 *in_stack_fffffffffffffcf0;
  FlowBuilder *in_stack_fffffffffffffcf8;
  bool *in_stack_fffffffffffffd30;
  Expression_lhs<const_std::atomic<bool>_&> *in_stack_fffffffffffffd38;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffd98;
  element_type *in_stack_fffffffffffffda0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffda8;
  Taskflow local_150;
  
  at = 0;
  this_00 = &local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8)
  ;
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffda8._M_pi,(size_t)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x11dcf6);
  tf::Taskflow::Taskflow(this_00);
  tf::FlowBuilder::
  emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_exceptions_cpp:337:20),_nullptr>
            (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
  __stat_loc = (void *)((long)&local_150._mutex.super___mutex_base._M_mutex + 8);
  tf::Executor::run((Executor *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                    in_stack_fffffffffffffcb0);
  std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffda0,__stat_loc);
  tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffcb0);
  res = (Result *)0x1d263f;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)this_00,at,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcbc,
             (char *)in_stack_fffffffffffffcb0,"",in_stack_fffffffffffffce0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer
            ((ExpressionDecomposer *)&stack0xfffffffffffffcf4,DT_REQUIRE);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<<std::atomic<bool>,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffcb0,(atomic<bool> *)res);
  this = (Executor *)EVar2.lhs;
  doctest::detail::Expression_lhs<std::atomic<bool>const&>::operator==
            (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffcb0,res);
  doctest::detail::Result::~Result((Result *)0x11de36);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffd28,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffcb0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x11df81);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffcb0);
    tf::Executor::~Executor(this);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void joined_subflow_2(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::atomic<bool> post_join {false};

  taskflow.emplace([&](tf::Subflow& sf0){
    for (int j = 0; j < 16; ++j) {
      sf0.emplace([] () {
        throw std::runtime_error("x");
      });
    }
    try {
      sf0.join();
      post_join = true;
    } catch(const std::runtime_error& re) {
      REQUIRE(std::strcmp(re.what(), "x") == 0);
    }
  });
  executor.run(taskflow).wait();
  REQUIRE(post_join == false);
}